

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<32,_2048>::FinalizePending(ObjectBlockPool<32,_2048> *this)

{
  SmallBlock<32> *marker;
  ulong uVar1;
  char *__function;
  uint uVar2;
  ExternTypeInfo *elementType;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->objectsToFinalize).count;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      if ((this->objectsToFinalize).count <= uVar3) {
        __function = 
        "T &FastVector<SmallBlock<32> *>::operator[](unsigned int) [T = SmallBlock<32> *, zeroNewMemory = false, skipConstructor = false]"
        ;
LAB_00222881:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,__function);
      }
      marker = (this->objectsToFinalize).data[uVar3];
      uVar1 = marker->marker;
      marker->marker = uVar1 | 1;
      uVar2 = (uint)(uVar1 >> 8) & 0xffffff;
      if (*(uint *)(NULLC::linker + 0x20c) <= uVar2) {
        __function = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00222881;
      }
      elementType = (ExternTypeInfo *)((ulong)(uVar2 * 0x50) + *(long *)(NULLC::linker + 0x200));
      if ((uVar1 & 0x10) == 0) {
        GC::CheckVariable((char *)(&marker->marker + 1),elementType);
      }
      else {
        uVar2._0_1_ = elementType->defaultAlign;
        uVar2._1_1_ = elementType->typeFlags;
        uVar2._2_2_ = elementType->pointerCount;
        if ((byte)(undefined1)uVar2 < 5) {
          uVar2 = 4;
        }
        GC::CheckArrayElements
                  (marker->data + (ulong)(uVar2 & 0xff) + 8,
                   *(uint *)((long)marker + (ulong)(uVar2 & 0xff) + 4),elementType);
      }
      NULLC::FinalizeObject(&marker->marker,(char *)marker);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  (this->objectsToFinalize).count = 0;
  return;
}

Assistant:

void FinalizePending()
	{
		for(unsigned i = 0, e = objectsToFinalize.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFinalize[i];

			markerType &marker = block->marker;

			// Mark block as used
			marker |= NULLC::OBJECT_VISIBLE;

			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			char *base = block->data;

			if(marker & NULLC::OBJECT_ARRAY)
			{
				unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

				unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

				GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
			}
			else
			{
				GC::CheckVariable(base + sizeof(markerType), typeInfo);
			}

			NULLC::FinalizeObject(marker, block->data);
		}

		objectsToFinalize.clear();
	}